

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O1

void audit_regressor_lda(audit_regressor_data *rd,single_learner *param_2,example *ec)

{
  byte bVar1;
  vw *pvVar2;
  vw *pvVar3;
  element_type *peVar4;
  io_buf *this;
  char *data;
  ostream *poVar5;
  weight *pwVar6;
  byte *pbVar7;
  ulong i;
  features *pfVar8;
  ulong uVar9;
  ulong uVar10;
  ostringstream tempstream;
  char local_208;
  undefined7 uStack_207;
  undefined1 local_1f8 [16];
  byte *local_1e8;
  uint32_t *local_1e0;
  uint32_t *local_1d8;
  sparse_parameters *local_1d0;
  undefined1 *local_1c8;
  uint local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pvVar2 = rd->all;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pbVar7 = (ec->super_example_predict).indices._begin;
  if (pbVar7 != (ec->super_example_predict).indices._end) {
    pvVar3 = rd->all;
    local_1d0 = &(pvVar3->weights).sparse_weights;
    local_1d8 = &(pvVar3->weights).sparse_weights._stride_shift;
    local_1e0 = &(pvVar3->weights).dense_weights._stride_shift;
    do {
      bVar1 = *pbVar7;
      local_1e8 = pbVar7;
      if ((ec->super_example_predict).feature_space[bVar1].values._end !=
          (ec->super_example_predict).feature_space[bVar1].values._begin) {
        pfVar8 = (ec->super_example_predict).feature_space + bVar1;
        uVar10 = 0;
        do {
          local_208 = '\t';
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,&local_208,1);
          peVar4 = (pfVar8->space_names)._begin[uVar10].
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,*(char **)&peVar4->first,
                              *(size_type *)((long)&peVar4->first + 8));
          local_208 = '^';
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_208,1);
          peVar4 = (pfVar8->space_names)._begin[uVar10].
                   super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(peVar4->second)._M_dataplus._M_p,
                              *(size_type *)((long)&peVar4->second + 8));
          local_208 = ':';
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_208,1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          if (pvVar2->lda != 0) {
            uVar9 = 0;
            do {
              i = (pfVar8->indicies)._begin[uVar10] + uVar9;
              if ((pvVar3->weights).sparse == true) {
                pwVar6 = sparse_parameters::operator[](local_1d0,i);
              }
              else {
                pwVar6 = (pvVar3->weights).dense_weights._begin +
                         (i & (pvVar3->weights).dense_weights._weight_mask);
              }
              local_208 = ':';
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_208,1);
              std::ostream::_M_insert<double>((double)*pwVar6);
              *pwVar6 = 0.0;
              uVar9 = uVar9 + 1;
            } while (uVar9 < pvVar2->lda);
          }
          std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + (char)local_1a8);
          std::ostream::put((char)local_1a8);
          std::ostream::flush();
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)(pfVar8->values)._end - (long)(pfVar8->values)._begin >> 2))
        ;
      }
      pbVar7 = local_1e8 + 1;
    } while (pbVar7 != (ec->super_example_predict).indices._end);
  }
  this = rd->out_file;
  std::__cxx11::stringbuf::str();
  data = (char *)CONCAT71(uStack_207,local_208);
  std::__cxx11::stringbuf::str();
  io_buf::bin_write_fixed(this,data,(ulong)local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if ((undefined1 *)CONCAT71(uStack_207,local_208) != local_1f8) {
    operator_delete((undefined1 *)CONCAT71(uStack_207,local_208));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void audit_regressor_lda(audit_regressor_data& rd, LEARNER::single_learner& /* base */, example& ec)
{
  vw& all = *rd.all;

  ostringstream tempstream;
  parameters& weights = rd.all->weights;
  for (unsigned char* i = ec.indices.begin(); i != ec.indices.end(); i++)
  {
    features& fs = ec.feature_space[*i];
    for (size_t j = 0; j < fs.size(); ++j)
    {
      tempstream << '\t' << fs.space_names[j].get()->first << '^' << fs.space_names[j].get()->second << ':'
                 << ((fs.indicies[j] >> weights.stride_shift()) & all.parse_mask);
      for (size_t k = 0; k < all.lda; k++)
      {
        weight& w = weights[(fs.indicies[j] + k)];
        tempstream << ':' << w;
        w = 0.;
      }
      tempstream << endl;
    }
  }

  rd.out_file->bin_write_fixed(tempstream.str().c_str(), (uint32_t)tempstream.str().size());
}